

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::scatterv<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
                  vector<int,_std::allocator<int>_> *msgs,
                  vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,int root,comm *comm)

{
  int iVar1;
  size_type sVar2;
  unsigned_long recv_size_00;
  const_reference msgs_00;
  size_t recv_size;
  comm *comm_local;
  int root_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes_local;
  vector<int,_std::allocator<int>_> *msgs_local;
  vector<int,_std::allocator<int>_> *result;
  
  iVar1 = mxx::comm::rank(comm);
  if (root == iVar1) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(sizes);
    iVar1 = mxx::comm::size(comm);
    if (sVar2 != (long)iVar1) {
      assert_fail("root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                  ,0x1cb,"scatterv");
    }
  }
  recv_size_00 = scatter_one<unsigned_long>(sizes,root,comm);
  msgs_00 = std::vector<int,_std::allocator<int>_>::operator[](msgs,0);
  scatterv<int>(__return_storage_ptr__,msgs_00,sizes,recv_size_00,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatterv(const std::vector<T>& msgs, const std::vector<size_t>& sizes, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size()));
    size_t recv_size = scatter_one<size_t>(sizes, root, comm);
    std::vector<T> result = scatterv(&msgs[0], sizes, recv_size, root, comm);
    return result;
}